

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BitsEqualFailure::BitsEqualFailure
          (BitsEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,
          unsigned_long expected,unsigned_long actual,unsigned_long mask,size_t byteCount,
          SimpleString *text)

{
  undefined4 in_ECX;
  UtestShell *in_RDX;
  TestFailure *in_RSI;
  SimpleString *in_RDI;
  undefined8 in_R8;
  SimpleString *in_stack_ffffffffffffffa0;
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  TestFailure *in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  TestFailure *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  SimpleString *value;
  
  value = in_RDI;
  TestFailure::TestFailure
            (in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (int)((ulong)in_R8 >> 0x20));
  in_RDI->buffer_ = (char *)&PTR__BitsEqualFailure_0025de00;
  TestFailure::createUserText(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SimpleString::operator=(in_stack_ffffffffffffffa0,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x212e0f);
  StringFromMaskedBits((unsigned_long)value,(unsigned_long)in_RSI,(size_t)in_RDX);
  StringFromMaskedBits((unsigned_long)value,(unsigned_long)in_RSI,(size_t)in_RDX);
  TestFailure::createButWasString
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  SimpleString::operator+=(in_stack_ffffffffffffffa0,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x212e7d);
  SimpleString::~SimpleString((SimpleString *)0x212e87);
  SimpleString::~SimpleString((SimpleString *)0x212e91);
  return;
}

Assistant:

BitsEqualFailure::BitsEqualFailure(UtestShell* test, const char* fileName, int lineNumber, unsigned long expected, unsigned long actual,
                                   unsigned long mask, size_t byteCount, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromMaskedBits(expected, mask, byteCount), StringFromMaskedBits(actual, mask, byteCount));
}